

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.h
# Opt level: O1

void __thiscall BlockFilter::Unserialize<DataStream>(BlockFilter *this,DataStream *s)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_filter_00;
  BlockFilterType BVar1;
  pointer puVar2;
  bool bVar3;
  char *pcVar4;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint8_t obj;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_filter;
  pointer puVar5;
  pointer puVar6;
  GCSFilter local_98;
  Params local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DataStream::read(s,(int)&local_98,(void *)0x1,in_RCX);
  BVar1 = (BlockFilterType)local_98.m_params.m_siphash_k0;
  DataStream::read(s,(int)this + 1,(void *)0x20,in_RCX);
  DataStream::operator>>(s,&local_38);
  this->m_filter_type = BVar1;
  local_58.m_siphash_k0 = 0;
  local_58.m_siphash_k1 = 0;
  local_58.m_P = '\0';
  local_58.m_M = 1;
  bVar3 = BuildParams(this,&local_58);
  puVar6 = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar2 = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar3) {
    local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    encoded_filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
    encoded_filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar5;
    encoded_filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar6;
    GCSFilter::GCSFilter(&local_98,&local_58,encoded_filter_00,SUB81(&stack0xffffffffffffff48,0));
    (this->m_filter).m_F = local_98.m_F;
    (this->m_filter).m_params.m_P = local_98.m_params.m_P;
    *(undefined3 *)&(this->m_filter).m_params.field_0x11 = local_98.m_params._17_3_;
    (this->m_filter).m_params.m_M = local_98.m_params.m_M;
    (this->m_filter).m_N = local_98.m_N;
    *(undefined4 *)&(this->m_filter).field_0x1c = local_98._28_4_;
    *(undefined4 *)&(this->m_filter).m_params.m_siphash_k0 =
         (undefined4)local_98.m_params.m_siphash_k0;
    *(undefined4 *)((long)&(this->m_filter).m_params.m_siphash_k0 + 4) =
         local_98.m_params.m_siphash_k0._4_4_;
    *(undefined4 *)&(this->m_filter).m_params.m_siphash_k1 =
         (undefined4)local_98.m_params.m_siphash_k1;
    *(undefined4 *)((long)&(this->m_filter).m_params.m_siphash_k1 + 4) =
         local_98.m_params.m_siphash_k1._4_4_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&(this->m_filter).m_encoded,&local_98.m_encoded);
    if (local_98.m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.m_encoded.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.m_encoded.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.m_encoded.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (puVar5 != (pointer)0x0) {
      operator_delete(puVar5,(long)puVar6 - (long)puVar5);
    }
    if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    local_98.m_params.m_siphash_k1 = std::iostream_category();
    local_98.m_params.m_siphash_k0._0_4_ = 1;
    std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)"unknown filter_type");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s) {
        std::vector<unsigned char> encoded_filter;
        uint8_t filter_type;

        s >> filter_type
          >> m_block_hash
          >> encoded_filter;

        m_filter_type = static_cast<BlockFilterType>(filter_type);

        GCSFilter::Params params;
        if (!BuildParams(params)) {
            throw std::ios_base::failure("unknown filter_type");
        }
        m_filter = GCSFilter(params, std::move(encoded_filter), /*skip_decode_check=*/false);
    }